

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O0

FT_Angle FT_Angle_Diff(FT_Angle angle1,FT_Angle angle2)

{
  undefined8 local_20;
  FT_Angle delta;
  FT_Angle angle2_local;
  FT_Angle angle1_local;
  
  for (local_20 = angle2 - angle1; local_20 < -0xb3ffff; local_20 = local_20 + 0x1680000) {
  }
  for (; 0xb40000 < local_20; local_20 = local_20 + -0x1680000) {
  }
  return local_20;
}

Assistant:

FT_EXPORT_DEF( FT_Angle )
  FT_Angle_Diff( FT_Angle  angle1,
                 FT_Angle  angle2 )
  {
    FT_Angle  delta = angle2 - angle1;


    while ( delta <= -FT_ANGLE_PI )
      delta += FT_ANGLE_2PI;

    while ( delta > FT_ANGLE_PI )
      delta -= FT_ANGLE_2PI;

    return delta;
  }